

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float out01;
  float out00;
  float tmp03;
  float tmp02;
  float tmp01;
  float tmp00;
  int m_3;
  float tmp1m;
  float tmp0m;
  float out0tm3;
  float out0tm2;
  float out0tm1;
  float out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [2] [4];
  float bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  float local_344;
  int local_2f8;
  int local_2dc;
  float *local_2d8;
  float *local_2d0;
  float *local_2c8;
  float *local_2c0;
  float *local_2b8;
  int local_2b0;
  int local_2ac;
  float local_2a8 [4];
  float afStack_298 [4];
  float local_288;
  void *local_278;
  int *local_270;
  ulong local_268;
  undefined4 local_260;
  long *local_258;
  int local_250;
  int local_24c;
  int local_248;
  undefined4 local_244;
  undefined4 local_240;
  ulong local_238;
  void *local_230;
  int *local_228;
  ulong local_220;
  undefined4 local_218;
  long *local_210;
  int local_208;
  int local_204;
  int local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  ulong local_1f0;
  int local_1e4;
  long local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  long *local_1b0;
  long *local_1a8;
  void **local_1a0;
  void **local_190;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  undefined1 local_13d;
  int local_13c;
  void **local_130;
  void **local_110;
  undefined1 local_fd;
  int local_fc;
  void **local_f0;
  void *local_c0;
  void *local_b0;
  int local_9c;
  void **local_98;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  void **local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  void *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  void **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1c4 = *(int *)((long)in_RSI + 0x2c);
  local_1c8 = (int)in_RSI[6];
  local_1cc = (int)in_RSI[7];
  local_1d0 = local_1c4 / 2;
  local_1d4 = local_1c8 / 2;
  local_1d8 = local_1d0 * local_1d4;
  local_1e0 = *in_RDX;
  local_1b0 = in_RSI;
  local_1a8 = in_RDI;
  for (local_1e4 = 0; local_1e4 < local_1cc; local_1e4 = local_1e4 + 1) {
    local_f0 = &local_230;
    local_64 = *(int *)((long)local_1a8 + 0x2c);
    local_68 = (int)local_1a8[6];
    local_6c = *(undefined4 *)((long)local_1a8 + 0x34);
    local_78 = (void *)(*local_1a8 + local_1a8[8] * (long)local_1e4 * local_1a8[2]);
    local_80 = local_1a8[2];
    local_84 = (undefined4)local_1a8[3];
    local_90 = (long *)local_1a8[4];
    local_60 = &local_230;
    local_228 = (int *)0x0;
    local_1fc = 1;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_1f0 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_80;
    local_208 = (int)local_1a8[5] + -1;
    if ((int)local_1a8[5] == 4) {
      local_1f0 = (long)*(int *)((long)local_1a8 + 0x2c) * (long)(int)local_1a8[6];
    }
    local_130 = &local_278;
    local_2c = *(int *)((long)local_1b0 + 0x2c);
    local_30 = (int)local_1b0[6];
    local_34 = *(undefined4 *)((long)local_1b0 + 0x34);
    local_40 = (void *)(*local_1b0 + local_1b0[8] * (long)local_1e4 * local_1b0[2]);
    local_48 = local_1b0[2];
    local_4c = (undefined4)local_1b0[3];
    local_58 = (long *)local_1b0[4];
    local_28 = &local_278;
    local_270 = (int *)0x0;
    local_244 = 1;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_238 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_250 = (int)local_1b0[5] + -1;
    if ((int)local_1b0[5] == 4) {
      local_238 = (long)*(int *)((long)local_1b0 + 0x2c) * (long)(int)local_1b0[6];
    }
    local_c = 0x10;
    local_1c = 0x10;
    local_fc = local_1e4;
    local_fd = 1;
    local_13c = local_1e4;
    local_13d = 1;
    if (local_1e0 == 0) {
      local_344 = 0.0;
    }
    else {
      local_344 = *(float *)(local_1e0 + (long)local_1e4 * 4);
    }
    local_288 = local_344;
    local_278 = local_40;
    local_268 = local_48;
    local_260 = local_4c;
    local_258 = local_58;
    local_24c = local_2c;
    local_248 = local_30;
    local_240 = local_34;
    local_230 = local_78;
    local_220 = local_80;
    local_218 = local_84;
    local_210 = local_90;
    local_204 = local_64;
    local_200 = local_68;
    local_1f8 = local_6c;
    for (local_2ac = 0; local_2ac < local_1d4; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 < local_1d0; local_2b0 = local_2b0 + 1) {
        local_110 = &local_230;
        local_2b8 = (float *)((long)local_230 + (long)(local_2ac * local_1d0 + local_2b0) * 4);
        local_2c0 = local_2b8 + local_1d8;
        local_2c8 = local_2b8 + (local_1d8 << 1);
        local_2d0 = local_2b8 + local_1d8 * 3;
        local_9c = local_2ac << 1;
        local_98 = &local_278;
        local_2d8 = (float *)((long)local_278 +
                             (long)(local_2b0 << 1) * 4 +
                             (long)local_24c * (long)local_9c * local_268);
        for (local_2dc = 0; local_2dc < 4; local_2dc = local_2dc + 1) {
          fVar1 = *local_2c0;
          fVar2 = *local_2c8;
          fVar3 = *local_2d0;
          local_2a8[local_2dc] = *local_2b8 + fVar1 + fVar2;
          local_2a8[(long)local_2dc + 4] = (fVar1 - fVar2) + fVar3;
          local_2b8 = local_2b8 + (local_1d8 << 2);
          local_2c0 = local_2c0 + (local_1d8 << 2);
          local_2c8 = local_2c8 + (local_1d8 << 2);
          local_2d0 = local_2d0 + (local_1d8 << 2);
        }
        for (local_2f8 = 0; local_2f8 < 2; local_2f8 = local_2f8 + 1) {
          fVar1 = local_2a8[(long)local_2f8 * 4 + 1];
          fVar2 = local_2a8[(long)local_2f8 * 4 + 2];
          fVar3 = local_2a8[(long)local_2f8 * 4 + 3];
          *local_2d8 = local_288 + local_2a8[(long)local_2f8 * 4] + fVar1 + fVar2;
          local_2d8[1] = ((local_288 + fVar1) - fVar2) + fVar3;
          local_2d8 = local_2d8 + local_1c4;
        }
      }
    }
    local_1a0 = &local_278;
    local_148 = local_1a0;
    if (local_270 != (int *)0x0) {
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *local_270;
      *local_270 = *local_270 + -1;
      UNLOCK();
      if (local_150 == 1) {
        if (local_258 == (long *)0x0) {
          local_c0 = local_278;
          if (local_278 != (void *)0x0) {
            free(local_278);
          }
        }
        else {
          (**(code **)(*local_258 + 0x18))(local_258,local_278);
        }
      }
    }
    local_278 = (void *)0x0;
    local_268 = 0;
    local_260 = 0;
    local_250 = 0;
    local_24c = 0;
    local_248 = 0;
    local_244 = 0;
    local_240 = 0;
    local_238 = 0;
    local_270 = (int *)0x0;
    local_190 = &local_230;
    local_168 = local_190;
    if (local_228 != (int *)0x0) {
      local_16c = 0xffffffff;
      LOCK();
      local_170 = *local_228;
      *local_228 = *local_228 + -1;
      UNLOCK();
      if (local_170 == 1) {
        if (local_210 == (long *)0x0) {
          local_b0 = local_230;
          if (local_230 != (void *)0x0) {
            free(local_230);
          }
        }
        else {
          (**(code **)(*local_210 + 0x18))(local_210,local_230);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 2;
    const int h_tiles = outh / 2;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[2][4] = {
    //     {1.0f,  1.0f,  1.0f,  0.0f},
    //     {0.0f,  1.0f, -1.0f,  1.0f}
    // };

    // 0 = r00 + r01 + r02
    // 1 = r01 - r02 + r03

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[2][4];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j);
                const float* output0_tm_1 = output0_tm_0 + tiles;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;

                float* output0 = out0.row(i * 2) + (j * 2);

                for (int m = 0; m < 4; m++)
                {
                    float out0tm0 = output0_tm_0[0];
                    float out0tm1 = output0_tm_1[0];
                    float out0tm2 = output0_tm_2[0];
                    float out0tm3 = output0_tm_3[0];

                    float tmp0m = out0tm0 + out0tm1 + out0tm2;
                    float tmp1m = out0tm1 - out0tm2 + out0tm3;

                    tmp[0][m] = tmp0m;
                    tmp[1][m] = tmp1m;

                    output0_tm_0 += tiles * 4;
                    output0_tm_1 += tiles * 4;
                    output0_tm_2 += tiles * 4;
                    output0_tm_3 += tiles * 4;
                }

                for (int m = 0; m < 2; m++)
                {
                    float tmp00 = tmp[m][0];
                    float tmp01 = tmp[m][1];
                    float tmp02 = tmp[m][2];
                    float tmp03 = tmp[m][3];

                    float out00 = bias0 + tmp00 + tmp01 + tmp02;
                    float out01 = bias0 + tmp01 - tmp02 + tmp03;

                    output0[0] = out00;
                    output0[1] = out01;

                    output0 += outw;
                }
            }
        }
    }
}